

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto,DeferredValidation *deferred_validation)

{
  bool bVar1;
  pointer pTVar2;
  string *psVar3;
  type this_00;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_78;
  FunctionRef<void_()> local_60;
  undefined1 local_50 [8];
  anon_class_32_4_3cd23a31 build_file;
  FileDescriptor *result;
  DeferredValidation *deferred_validation_local;
  FileDescriptorProto *proto_local;
  DescriptorPool *this_local;
  
  absl::lts_20250127::Mutex::AssertHeld(this->mutex_);
  this->build_started_ = true;
  pTVar2 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  psVar3 = FileDescriptorProto::name_abi_cxx11_(proto);
  bVar1 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::contains<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)&pTVar2->known_bad_files_,psVar3);
  if (bVar1) {
    this_local = (DescriptorPool *)0x0;
  }
  else {
    local_50 = (undefined1  [8])&build_file.proto;
    build_file.result = (FileDescriptor **)this;
    build_file.this = (DescriptorPool *)deferred_validation;
    build_file.deferred_validation = (DeferredValidation *)proto;
    bVar1 = std::operator!=(&this->dispatcher_,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = std::
                unique_ptr<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                ::operator*(&this->dispatcher_);
      absl::lts_20250127::FunctionRef<void()>::
      FunctionRef<google::protobuf::DescriptorPool::BuildFileFromDatabase(google::protobuf::FileDescriptorProto_const&,google::protobuf::DescriptorPool::DeferredValidation&)const::__0,void>
                ((FunctionRef<void()> *)&local_60,(anon_class_32_4_3cd23a31 *)local_50);
      absl::lts_20250127::internal_any_invocable::
      Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const>::operator()
                ((Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)this_00,local_60);
    }
    else {
      BuildFileFromDatabase::anon_class_32_4_3cd23a31::operator()
                ((anon_class_32_4_3cd23a31 *)local_50);
    }
    if (build_file.proto == (FileDescriptorProto *)0x0) {
      pTVar2 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      psVar3 = FileDescriptorProto::name_abi_cxx11_(proto);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_78,
                 &(pTVar2->known_bad_files_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,psVar3);
    }
    this_local = (DescriptorPool *)build_file.proto;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto,
    DeferredValidation& deferred_validation) const {
  mutex_->AssertHeld();
  build_started_ = true;
  if (tables_->known_bad_files_.contains(proto.name())) {
    return nullptr;
  }
  const FileDescriptor* result;
  const auto build_file = [&] {
    result = DescriptorBuilder::New(this, tables_.get(), deferred_validation,
                                    default_error_collector_)
                 ->BuildFile(proto);
  };
  if (dispatcher_ != nullptr) {
    (*dispatcher_)(build_file);
  } else {
    build_file();
  }
  if (result == nullptr) {
    tables_->known_bad_files_.insert(proto.name());
  }
  return result;
}